

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

void get_all_encoding_parameters
               (opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 tileno,OPJ_INT32 *p_tx0,
               OPJ_INT32 *p_tx1,OPJ_INT32 *p_ty0,OPJ_INT32 *p_ty1,OPJ_UINT32 *p_dx_min,
               OPJ_UINT32 *p_dy_min,OPJ_UINT32 *p_max_prec,OPJ_UINT32 *p_max_res,
               OPJ_UINT32 **p_resolutions)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  OPJ_UINT32 OVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 *pOVar17;
  OPJ_UINT32 OVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  opj_tccp_t *poVar22;
  opj_image_comp_t *local_88;
  
  poVar22 = p_cp->tcps[tileno].tccps;
  local_88 = p_image->comps;
  uVar9 = tileno / p_cp->tw;
  uVar11 = tileno % p_cp->tw;
  OVar18 = p_cp->tdx * uVar11 + p_cp->tx0;
  if ((int)OVar18 <= (int)p_image->x0) {
    OVar18 = p_image->x0;
  }
  *p_tx0 = OVar18;
  OVar18 = (uVar11 + 1) * p_cp->tdx + p_cp->tx0;
  if ((int)p_image->x1 <= (int)OVar18) {
    OVar18 = p_image->x1;
  }
  *p_tx1 = OVar18;
  OVar18 = p_cp->tdy * uVar9 + p_cp->ty0;
  if ((int)OVar18 <= (int)p_image->y0) {
    OVar18 = p_image->y0;
  }
  *p_ty0 = OVar18;
  OVar18 = (uVar9 + 1) * p_cp->tdy + p_cp->ty0;
  if ((int)p_image->y1 <= (int)OVar18) {
    OVar18 = p_image->y1;
  }
  *p_ty1 = OVar18;
  *p_max_prec = 0;
  *p_max_res = 0;
  *p_dx_min = 0x7fffffff;
  *p_dy_min = 0x7fffffff;
  for (uVar10 = 0; uVar10 < p_image->numcomps; uVar10 = uVar10 + 1) {
    pOVar17 = p_resolutions[uVar10];
    OVar18 = local_88->dx;
    OVar1 = local_88->dy;
    iVar2 = *p_tx0;
    iVar3 = *p_ty0;
    iVar4 = *p_tx1;
    iVar5 = *p_ty1;
    uVar9 = poVar22->numresolutions;
    if (*p_max_res < uVar9) {
      *p_max_res = uVar9;
      uVar9 = poVar22->numresolutions;
    }
    uVar11 = uVar9;
    for (uVar13 = 0; uVar11 = uVar11 - 1, uVar13 < uVar9; uVar13 = uVar13 + 1) {
      OVar16 = poVar22->prcw[uVar13];
      OVar15 = poVar22->prch[uVar13];
      *pOVar17 = OVar16;
      pOVar17[1] = OVar15;
      bVar6 = (byte)uVar11;
      bVar7 = (byte)OVar16;
      OVar14 = local_88->dx << (bVar6 + bVar7 & 0x1f);
      bVar8 = (byte)OVar15;
      OVar16 = local_88->dy << (bVar6 + bVar8 & 0x1f);
      if ((int)*p_dx_min < (int)OVar14) {
        OVar14 = *p_dx_min;
      }
      *p_dx_min = OVar14;
      if ((int)*p_dy_min < (int)OVar16) {
        OVar16 = *p_dy_min;
      }
      iVar21 = 1 << (bVar6 & 0x1f);
      iVar20 = (int)(iVar2 + (OVar18 - 1)) / (int)OVar18 + -1 + iVar21 >> (bVar6 & 0x1f);
      iVar19 = (int)(iVar3 + (OVar1 - 1)) / (int)OVar1 + -1 + iVar21 >> (bVar6 & 0x1f);
      iVar12 = (int)((OVar18 - 1) + iVar4) / (int)OVar18 + -1 + iVar21 >> (bVar6 & 0x1f);
      iVar21 = iVar21 + (int)((OVar1 - 1) + iVar5) / (int)OVar1 + -1 >> (bVar6 & 0x1f);
      OVar15 = (((1 << (bVar7 & 0x1f)) + iVar12 + -1 >> (bVar7 & 0x1f)) - (iVar20 >> (bVar7 & 0x1f))
               << (bVar7 & 0x1f)) >> (bVar7 & 0x1f);
      if (iVar20 == iVar12) {
        OVar15 = 0;
      }
      *p_dy_min = OVar16;
      OVar16 = ((iVar21 + (1 << (bVar8 & 0x1f)) + -1 >> (bVar8 & 0x1f)) - (iVar19 >> (bVar8 & 0x1f))
               << (bVar8 & 0x1f)) >> (bVar8 & 0x1f);
      if (iVar19 == iVar21) {
        OVar16 = 0;
      }
      pOVar17[2] = OVar15;
      pOVar17[3] = OVar16;
      if (*p_max_prec < OVar16 * OVar15) {
        *p_max_prec = OVar16 * OVar15;
      }
      uVar9 = poVar22->numresolutions;
      pOVar17 = pOVar17 + 4;
    }
    poVar22 = poVar22 + 1;
    local_88 = local_88 + 1;
  }
  return;
}

Assistant:

void get_all_encoding_parameters(
								const opj_image_t *p_image,
								const opj_cp_v2_t *p_cp,
								OPJ_UINT32 tileno,
								OPJ_INT32 * p_tx0,
								OPJ_INT32 * p_tx1,
								OPJ_INT32 * p_ty0,
								OPJ_INT32 * p_ty1,
								OPJ_UINT32 * p_dx_min,
								OPJ_UINT32 * p_dy_min,
								OPJ_UINT32 * p_max_prec,
								OPJ_UINT32 * p_max_res,
								OPJ_UINT32 ** p_resolutions
							)
{
	// loop
	OPJ_UINT32 compno, resno;

	// pointers
	const opj_tcp_v2_t *tcp = 00;
	const opj_tccp_t * l_tccp = 00;
	const opj_image_comp_t * l_img_comp = 00;

	// to store l_dx, l_dy, w and h for each resolution and component.
	OPJ_UINT32 * lResolutionPtr;

	// position in x and y of tile
	OPJ_UINT32 p, q;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(tileno < p_cp->tw * p_cp->th);

	// initializations
	tcp = &p_cp->tcps [tileno];
	l_tccp = tcp->tccps;
	l_img_comp = p_image->comps;

	// position in x and y of tile

	p = tileno % p_cp->tw;
	q = tileno / p_cp->tw;

	/* here calculation of tx0, tx1, ty0, ty1, maxprec, l_dx and l_dy */
	*p_tx0 = int_max(p_cp->tx0 + p * p_cp->tdx, p_image->x0);
	*p_tx1 = int_min(p_cp->tx0 + (p + 1) * p_cp->tdx, p_image->x1);
	*p_ty0 = int_max(p_cp->ty0 + q * p_cp->tdy, p_image->y0);
	*p_ty1 = int_min(p_cp->ty0 + (q + 1) * p_cp->tdy, p_image->y1);

	// max precision and resolution is 0 (can only grow)
	*p_max_prec = 0;
	*p_max_res = 0;

	// take the largest value for dx_min and dy_min
	*p_dx_min = 0x7fffffff;
	*p_dy_min  = 0x7fffffff;

	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		// aritmetic variables to calculate
		OPJ_UINT32 l_level_no;
		OPJ_INT32 l_rx0, l_ry0, l_rx1, l_ry1;
		OPJ_INT32 l_px0, l_py0, l_px1, py1;
		OPJ_UINT32 l_product;
		OPJ_INT32 l_tcx0, l_tcy0, l_tcx1, l_tcy1;
		OPJ_UINT32 l_pdx, l_pdy , l_pw , l_ph;

		lResolutionPtr = p_resolutions[compno];

		l_tcx0 = int_ceildiv(*p_tx0, l_img_comp->dx);
		l_tcy0 = int_ceildiv(*p_ty0, l_img_comp->dy);
		l_tcx1 = int_ceildiv(*p_tx1, l_img_comp->dx);
		l_tcy1 = int_ceildiv(*p_ty1, l_img_comp->dy);
		if
			(l_tccp->numresolutions > *p_max_res)
		{
			*p_max_res = l_tccp->numresolutions;
		}

		// use custom size for precincts
		l_level_no = l_tccp->numresolutions - 1;
		for
			(resno = 0; resno < l_tccp->numresolutions; ++resno)
		{
			OPJ_UINT32 l_dx, l_dy;
			// precinct width and height
			l_pdx = l_tccp->prcw[resno];
			l_pdy = l_tccp->prch[resno];
			*lResolutionPtr++ = l_pdx;
			*lResolutionPtr++ = l_pdy;
			l_dx = l_img_comp->dx * (1 << (l_pdx + l_level_no));
			l_dy = l_img_comp->dy * (1 << (l_pdy + l_level_no));
			// take the minimum size for l_dx for each comp and resolution
			*p_dx_min = int_min(*p_dx_min, l_dx);
			*p_dy_min = int_min(*p_dy_min, l_dy);
			// various calculations of extents

			l_rx0 = int_ceildivpow2(l_tcx0, l_level_no);
			l_ry0 = int_ceildivpow2(l_tcy0, l_level_no);
			l_rx1 = int_ceildivpow2(l_tcx1, l_level_no);
			l_ry1 = int_ceildivpow2(l_tcy1, l_level_no);
			l_px0 = int_floordivpow2(l_rx0, l_pdx) << l_pdx;
			l_py0 = int_floordivpow2(l_ry0, l_pdy) << l_pdy;
			l_px1 = int_ceildivpow2(l_rx1, l_pdx) << l_pdx;
			py1 = int_ceildivpow2(l_ry1, l_pdy) << l_pdy;
			l_pw = (l_rx0==l_rx1)?0:((l_px1 - l_px0) >> l_pdx);
			l_ph = (l_ry0==l_ry1)?0:((py1 - l_py0) >> l_pdy);
			*lResolutionPtr++ = l_pw;
			*lResolutionPtr++ = l_ph;
			l_product = l_pw * l_ph;
			// update precision
			if
				(l_product > *p_max_prec)
			{
				*p_max_prec = l_product;
			}
			--l_level_no;
		}
		++l_tccp;
		++l_img_comp;
	}
}